

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O0

void Abc_FrameSetCurrentNetwork(Abc_Frame_t *p,Abc_Ntk_t *pNtkNew)

{
  char *__nptr;
  int iStep;
  char *pValue;
  int nNetsToSave;
  int nNetsPresent;
  Abc_Ntk_t *pNtk3;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Frame_t *p_local;
  
  if (p->pNtkCur != pNtkNew) {
    Abc_NtkSetBackup(pNtkNew,p->pNtkCur);
    iStep = p->nSteps + 1;
    p->nSteps = iStep;
    Abc_NtkSetStep(pNtkNew,iStep);
    p->pNtkCur = pNtkNew;
    __nptr = Cmd_FlagReadByName(p,"savesteps");
    if (__nptr == (char *)0x0) {
      pValue._0_4_ = 1;
    }
    else {
      pValue._0_4_ = atoi(__nptr);
    }
    pValue._4_4_ = 0;
    _nNetsToSave = (Abc_Ntk_t *)0x0;
    pNtk3 = (Abc_Ntk_t *)0x0;
    for (pNtk2 = p->pNtkCur; pNtk2 != (Abc_Ntk_t *)0x0; pNtk2 = Abc_NtkBackup(pNtk2)) {
      pValue._4_4_ = pValue._4_4_ + 1;
      _nNetsToSave = pNtk3;
      pNtk3 = pNtk2;
    }
    if ((int)pValue < pValue._4_4_ + -1) {
      Abc_NtkDelete(pNtk3);
      Abc_NtkSetBackup(_nNetsToSave,(Abc_Ntk_t *)0x0);
    }
  }
  return;
}

Assistant:

void Abc_FrameSetCurrentNetwork( Abc_Frame_t * p, Abc_Ntk_t * pNtkNew )
{
    Abc_Ntk_t * pNtk, * pNtk2, * pNtk3;
    int nNetsPresent;
    int nNetsToSave;
    char * pValue;

    if ( p->pNtkCur == pNtkNew )
        return;

    // link it to the previous network
    Abc_NtkSetBackup( pNtkNew, p->pNtkCur );
    // set the step of this network
    Abc_NtkSetStep( pNtkNew, ++p->nSteps );
    // set this network to be the current network
    p->pNtkCur = pNtkNew;

    // remove any extra network that may happen to be in the stack
    pValue = Cmd_FlagReadByName( p, "savesteps" );
    // if the value of steps to save is not set, assume 1-level undo
    if ( pValue == NULL )
        nNetsToSave = 1;
    else 
        nNetsToSave = atoi(pValue);
    
    // count the network, remember the last one, and the one before the last one
    nNetsPresent = 0;
    pNtk2 = pNtk3 = NULL;
    for ( pNtk = p->pNtkCur; pNtk; pNtk = Abc_NtkBackup(pNtk2) )
    {
        nNetsPresent++;
        pNtk3 = pNtk2;
        pNtk2 = pNtk;
    }

    // remove the earliest backup network if it is more steps away than we store
    if ( nNetsPresent - 1 > nNetsToSave )
    { // delete the last network
        Abc_NtkDelete( pNtk2 );
        // clean the pointer of the network before the last one
        Abc_NtkSetBackup( pNtk3, NULL );
    }
}